

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

void evsig_set_base_(event_base *base)

{
  void *pvVar1;
  
  if (evsig_base_lock == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    (*evthread_lock_fns_.lock)(0,evsig_base_lock);
    pvVar1 = evsig_base_lock;
  }
  evsig_base = base;
  evsig_base_n_signals_added = (base->sig).ev_n_signals_added;
  evsig_base_fd = (base->sig).ev_signal_pair[1];
  if (pvVar1 != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,pvVar1);
    return;
  }
  return;
}

Assistant:

void
evsig_set_base_(struct event_base *base)
{
	EVSIGBASE_LOCK();
	evsig_base = base;
	evsig_base_n_signals_added = base->sig.ev_n_signals_added;
	evsig_base_fd = base->sig.ev_signal_pair[1];
	EVSIGBASE_UNLOCK();
}